

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::(anonymous_namespace)::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *descriptor)

{
  FileDescriptor *pFVar1;
  FileDescriptor *pFVar2;
  csharp *pcVar3;
  string *psVar4;
  _anonymous_namespace_ *p_Var5;
  csharp *pcVar6;
  bool in_R9B;
  bool bVar7;
  string_view input;
  
  pFVar2 = descriptor;
  if (descriptor == (FileDescriptor *)0x0) {
    pFVar2 = (FileDescriptor *)0x0;
  }
  else {
    do {
      pFVar1 = (FileDescriptor *)((long)&pFVar2[-1].source_code_info_ + 7);
      if (pFVar2 == (FileDescriptor *)0x0) {
        pFVar1 = (FileDescriptor *)0xffffffffffffffff;
        break;
      }
      p_Var5 = this + -1 + (long)pFVar2;
      pFVar2 = pFVar1;
    } while (*p_Var5 != (_anonymous_namespace_)0x2f);
    pFVar2 = (FileDescriptor *)(long)((int)pFVar1 + 1);
    if (descriptor < pFVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pFVar2);
    }
  }
  pcVar6 = (csharp *)((long)descriptor - (long)pFVar2);
  if (pcVar6 == (csharp *)0x0) {
    pcVar3 = (csharp *)0xffffffffffffffff;
  }
  else {
    p_Var5 = this + (long)&descriptor->super_SymbolBase;
    pcVar3 = pcVar6;
    do {
      p_Var5 = p_Var5 + -1;
      bVar7 = pcVar3 == (csharp *)0x0;
      pcVar3 = pcVar3 + -1;
      if (bVar7) {
        pcVar3 = (csharp *)0xffffffffffffffff;
        break;
      }
    } while (*p_Var5 != (_anonymous_namespace_)0x2e);
    pcVar3 = (csharp *)(long)(int)pcVar3;
  }
  if (pcVar6 < pcVar3) {
    pcVar3 = pcVar6;
  }
  input._M_str = (char *)0x1;
  input._M_len = (size_t)(this + (long)pFVar2);
  psVar4 = UnderscoresToCamelCase_abi_cxx11_(__return_storage_ptr__,pcVar3,input,false,in_R9B);
  return psVar4;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
  const absl::string_view proto_file = descriptor->name();
  int lastslash = proto_file.find_last_of('/');
  const absl::string_view base = proto_file.substr(lastslash + 1);
  return UnderscoresToPascalCase(StripDotProto(base));
}